

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O1

void __thiscall Debugger::Stop(Debugger *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar1;
  unique_lock<std::mutex> luaThreadLock;
  unique_lock<std::mutex> local_28;
  
  this->running = false;
  this->skipHook = true;
  this->blocking = false;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->hookStateMtx);
  if (iVar1 == 0) {
    this_00 = (this->hookState).super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->hookState).super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->hookState).super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->hookStateMtx);
    local_28._M_device = &this->luaThreadMtx;
    local_28._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_28);
    local_28._M_owns = true;
    std::
    vector<std::function<void_(lua_State_*)>,_std::allocator<std::function<void_(lua_State_*)>_>_>::
    _M_erase_at_end(&this->luaThreadExecutors,
                    (this->luaThreadExecutors).
                    super__Vector_base<std::function<void_(lua_State_*)>,_std::allocator<std::function<void_(lua_State_*)>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    std::unique_lock<std::mutex>::~unique_lock(&local_28);
    this->blocking = false;
    std::condition_variable::notify_all();
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void Debugger::Stop() {
	running = false;
	skipHook = true;
	blocking = false;

	// 停止main_state 的hook
	// 但不停止coroutine的hook因为没有办法知道这个lua state 指针是否有效
	// stop在交互线程，不应该设置hook
	// 而且清理对lua_state 的 hook没有必要
	// UpdateHook(0, mainL);

	// 清理hook 状态
	{
		std::lock_guard<std::mutex> lock(hookStateMtx);
		hookState = nullptr;
	}

	{
		// clear lua thread executors
		std::unique_lock<std::mutex> luaThreadLock(luaThreadMtx);
		luaThreadExecutors.clear();
	}
	ExitDebugMode();
}